

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_connection_base.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::web_connection_base::get_specific_peer_info(web_connection_base *this,peer_info *p)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  peer_info *p_local;
  web_connection_base *this_local;
  
  bVar1 = peer_connection::is_interesting(&this->super_peer_connection);
  if (bVar1) {
    libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>::operator|=
              (&p->flags,(bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>)1);
  }
  uVar2 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0xc])();
  if ((uVar2 & 1) != 0) {
    libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>::operator|=
              (&p->flags,(bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>)2);
  }
  bVar1 = peer_connection::is_connecting(&this->super_peer_connection);
  if ((!bVar1) && (uVar3 = ::std::__cxx11::string::empty(), (uVar3 & 1) != 0)) {
    libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>::operator|=
              (&p->flags,(bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>)0x40);
  }
  bVar1 = peer_connection::is_connecting(&this->super_peer_connection);
  if (bVar1) {
    libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>::operator|=
              (&p->flags,(bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>)0x80);
  }
  ::std::__cxx11::string::operator=((string *)p,(string *)&this->m_server_string);
  return;
}

Assistant:

void web_connection_base::get_specific_peer_info(peer_info& p) const
	{
		if (is_interesting()) p.flags |= peer_info::interesting;
		if (is_choked()) p.flags |= peer_info::choked;
		if (!is_connecting() && m_server_string.empty())
			p.flags |= peer_info::handshake;
		if (is_connecting()) p.flags |= peer_info::connecting;

		p.client = m_server_string;
	}